

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_get_max_in_record_payload(mbedtls_ssl_context *ssl)

{
  size_t sVar1;
  size_t mfl;
  size_t max_len;
  mbedtls_ssl_context *ssl_local;
  
  mfl = 0x400;
  sVar1 = mbedtls_ssl_get_input_max_frag_len(ssl);
  if (sVar1 < 0x400) {
    mfl = sVar1;
  }
  return (int)mfl;
}

Assistant:

int mbedtls_ssl_get_max_in_record_payload(const mbedtls_ssl_context *ssl)
{
    size_t max_len = MBEDTLS_SSL_IN_CONTENT_LEN;

#if !defined(MBEDTLS_SSL_MAX_FRAGMENT_LENGTH)
    (void) ssl;
#endif

#if defined(MBEDTLS_SSL_MAX_FRAGMENT_LENGTH)
    const size_t mfl = mbedtls_ssl_get_input_max_frag_len(ssl);

    if (max_len > mfl) {
        max_len = mfl;
    }
#endif

    return (int) max_len;
}